

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

int match_tzofs(date_parse_result *res,char **str,size_t *len)

{
  char cVar1;
  int32_t gmtofs_secs;
  int iVar2;
  int iVar3;
  CVmTimeZone *pCVar4;
  char *p;
  size_t rem;
  int ss;
  int mi;
  int hh;
  date_parse_string part;
  char *local_68;
  size_t local_60;
  int local_54;
  int local_50;
  int local_4c;
  date_parse_string local_48;
  
  local_68 = *str;
  local_60 = *len;
  local_48.p = (char *)0x0;
  local_48.len = 0;
  iVar2 = match_lit(&local_68,&local_60,"^GMT",4,&local_48);
  if (local_60 == 0) {
    return 0;
  }
  cVar1 = *local_68;
  if ((cVar1 != '-') && (cVar1 != '+')) {
    return 0;
  }
  local_68 = local_68 + 1;
  local_60 = local_60 - 1;
  iVar3 = match_digits(&local_4c,&local_68,&local_60,"0509",&local_48);
  if (iVar3 == 0) {
    if (iVar2 == 0) {
      return 0;
    }
    iVar2 = match_digits(&local_4c,&local_68,&local_60,"09",&local_48);
    if (iVar2 == 0) {
      return 0;
    }
  }
  local_50 = 0;
  if ((local_60 == 0) || (*local_68 != ':')) {
    match_digits(&local_50,&local_68,&local_60,"0509",&local_48);
LAB_00258f4c:
    local_54 = 0;
    if ((local_60 == 0) || (*local_68 != ':')) {
      match_digits(&local_54,&local_68,&local_60,"0509",&local_48);
    }
    else {
      local_68 = local_68 + 1;
      local_60 = local_60 - 1;
      iVar2 = match_digits(&local_54,&local_68,&local_60,"0509",&local_48);
      if (iVar2 == 0) goto LAB_00258f95;
    }
    iVar2 = local_50 * 0x3c + local_4c * 0xe10 + local_54;
    gmtofs_secs = -iVar2;
    if (cVar1 == '+') {
      gmtofs_secs = iVar2;
    }
    pCVar4 = CVmTimeZoneCache::get_gmtofs_zone(G_tzcache_X,gmtofs_secs);
    res->tz = pCVar4;
    res->tzofs = gmtofs_secs * 1000;
    (res->ptz).p = *str;
    (res->ptz).len = (long)local_68 - (long)*str;
    *str = local_68;
    *len = local_60;
    iVar2 = 1;
  }
  else {
    local_68 = local_68 + 1;
    local_60 = local_60 - 1;
    iVar2 = match_digits(&local_50,&local_68,&local_60,"0509",&local_48);
    if (iVar2 != 0) goto LAB_00258f4c;
LAB_00258f95:
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int match_tzofs(VMG_ date_parse_result *res,
                       const char *&str, size_t &len)
{
    const char *p = str;
    size_t rem = len;

    /* first, skip "gmt" if present */
    date_parse_string part;
    int gmtlit = match_lit(p, rem, "^GMT", part);

    /* get the sign */
    if (rem == 0 || (*p != '+' && *p != '-'))
        return FALSE;
    int s = (*p == '+' ? 1 : -1);

    /* skip the sign */
    ++p, --rem;

    /* 
     *   Get the "hh".  If the "GMT" literal was present, allow a single
     *   digit; otherwise require the two-digit format. 
     */
    int hh;
    if (!match_digits(hh, p, rem, "0509", part)
        && (!gmtlit || !match_digits(hh, p, rem, "09", part)))
        return FALSE;

    /* 
     *   check for ":" - if present, the minutes must be present, otherwise
     *   they're optional 
     */
    int mi = 0;
    if (rem != 0 && *p == ':')
    {
        /* skip the ":", then require the minutes */
        ++p, --rem;
        if (!match_digits(mi, p, rem, "0509", part))
            return FALSE;
    }
    else
    {
        /* no ":", so the minuts are optional */
        match_digits(mi, p, rem, "0509", part);
    }

    /* likewise, check for ":ss" */
    int ss = 0;
    if (rem != 0 && *p == ':')
    {
        ++p, --rem;
        if (!match_digits(ss, p, rem, "0509", part))
            return FALSE;
    }
    else
    {
        match_digits(ss, p, rem, "0509", part);
    }

    /* success - figure the offset in seconds */
    int32_t ofs = s * ((hh*60*60) + (mi*60) + ss);

    /* look up the zone by offset */
    res->tz = G_tzcache->get_gmtofs_zone(vmg_ ofs);

    /* also set the explicit offset value (in milliseconds) */
    res->tzofs = ofs * 1000;

    /* set the capture data */
    res->ptz.p = str;
    res->ptz.len = p - str;

    /* advance the caller's vars past the parsed tzofs and return success */
    str = p;
    len = rem;
    return TRUE;
}